

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  value_type vVar1;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  __first;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __first_00;
  const_iterator __position;
  const_iterator __position_00;
  bool bVar2;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *pvVar3;
  float *pfVar4;
  vector<float,_std::allocator<float>_> *pvVar5;
  reference pvVar6;
  size_type sVar7;
  reference this_00;
  reference pvVar8;
  reference pvVar9;
  undefined8 in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  float fVar10;
  float fVar11;
  double dVar12;
  float *outptr;
  float score_1;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  size_t z;
  size_t i_2;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> *box_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *box_bbox_rects;
  int i_1;
  BBoxRect c;
  float confidence;
  float score;
  int q;
  float class_score;
  int class_index;
  float box_score;
  float bbox_ymax;
  float bbox_xmax;
  float bbox_ymin;
  float bbox_xmin;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  int j;
  int i;
  Mat scores;
  float *box_score_ptr;
  float *hptr;
  float *wptr;
  float *yptr;
  float *xptr;
  float bias_h;
  float bias_w;
  int p;
  int pp;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_box_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_box_bbox_rects;
  int channels_per_box;
  int channels;
  int h;
  int w;
  Mat *bottom_top_blob;
  size_t b;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb08;
  Mat *in_stack_fffffffffffffb10;
  undefined7 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1f;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb20;
  size_type in_stack_fffffffffffffb28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar13;
  Mat *in_stack_fffffffffffffb30;
  iterator in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb50;
  float in_stack_fffffffffffffb54;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  float in_stack_fffffffffffffb64;
  float in_stack_fffffffffffffb68;
  float in_stack_fffffffffffffb6c;
  float *in_stack_fffffffffffffbb0;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  *in_stack_fffffffffffffbb8;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *bboxes;
  int local_414;
  vector<float,_std::allocator<float>_> *local_3f8;
  vector<float,_std::allocator<float>_> local_3f0;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_3d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3c0;
  float *local_3a8;
  float *local_3a0;
  float *local_398;
  float *local_390;
  BBoxRect *local_380;
  BBoxRect *local_378;
  BBoxRect *local_370;
  BBoxRect *local_368;
  reference local_358;
  reference local_350;
  int local_344;
  float local_340;
  float local_33c;
  float local_338;
  float local_334;
  int local_330;
  float local_32c;
  Mat local_328;
  float local_2dc;
  int local_2d8;
  float local_2d4;
  int local_2d0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  float local_2c0;
  float local_2bc;
  float local_2b8;
  float local_2b4;
  float local_2b0;
  float local_2ac;
  int local_2a8;
  int local_2a4;
  undefined1 local_2a0 [72];
  Mat local_258;
  float *local_210;
  Mat local_208;
  float *local_1c0;
  Mat local_1b8;
  float *local_170;
  Mat local_168;
  float *local_120;
  Mat local_118;
  float *local_d0;
  float local_c4;
  float local_c0;
  int local_bc;
  int local_b8;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_a8;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_90;
  undefined4 local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  reference local_60;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *local_58;
  undefined1 local_50 [56];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_50._48_8_ = in_RDX;
  local_18 = in_RSI;
  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x6b6d0c);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x6b6d19);
  local_58 = (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x0;
  do {
    bboxes = local_58;
    pvVar3 = (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
             std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
    fVar10 = (float)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
    if (pvVar3 <= bboxes) {
      qsort_descent_inplace<ncnn::BBoxRect>
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb20,
                 (vector<float,_std::allocator<float>_> *)
                 CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
      pvVar13 = &local_3c0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x6b78ee);
      nms_sorted_bboxes(bboxes,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffffbb8,fVar10);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x6b791f);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x6b792c);
      local_3f8 = (vector<float,_std::allocator<float>_> *)0x0;
      while( true ) {
        in_stack_fffffffffffffb20 = local_3f8;
        pvVar5 = (vector<float,_std::allocator<float>_> *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_3c0);
        if (pvVar5 <= in_stack_fffffffffffffb20) break;
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_3c0,(size_type)local_3f8);
        sVar7 = *pvVar6;
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)(local_50 + 0x18),
                   sVar7);
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                   in_stack_fffffffffffffb20,
                   (value_type *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
        std::vector<float,_std::allocator<float>_>::operator[]
                  ((vector<float,_std::allocator<float>_> *)local_50,sVar7);
        std::vector<float,_std::allocator<float>_>::push_back
                  (in_stack_fffffffffffffb20,
                   (value_type_conflict4 *)
                   CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
        local_3f8 = (vector<float,_std::allocator<float>_> *)
                    ((long)&(((_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             &local_3f8->super__Vector_base<float,_std::allocator<float>_>)->_M_impl
                            ).super__Vector_impl_data._M_start + 1);
      }
      sVar7 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size(&local_3d8);
      if ((int)sVar7 == 0) {
        local_4 = 0;
      }
      else {
        this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
        ncnn::Mat::create(in_stack_fffffffffffffb30,(int)((ulong)pvVar13 >> 0x20),(int)pvVar13,
                          (size_t)in_stack_fffffffffffffb20,
                          (Allocator *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18)
                         );
        bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffb10);
        if (bVar2) {
          local_4 = -100;
        }
        else {
          for (local_414 = 0; local_414 < (int)sVar7; local_414 = local_414 + 1) {
            pvVar8 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                               (&local_3d8,(long)local_414);
            pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&local_3f0,(long)local_414);
            vVar1 = *pvVar9;
            pfVar4 = ncnn::Mat::row(this_00,local_414);
            *pfVar4 = (float)(pvVar8->label + 1);
            pfVar4[1] = vVar1;
            pfVar4[2] = pvVar8->xmin;
            pfVar4[3] = pvVar8->ymin;
            pfVar4[4] = pvVar8->xmax;
            pfVar4[5] = pvVar8->ymax;
          }
          local_4 = 0;
        }
      }
      local_74 = 1;
      std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffb20);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb20);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb20)
      ;
LAB_006b7c8c:
      std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffb20);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb20);
      return local_4;
    }
    local_60 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         (local_18,(size_type)local_58);
    local_64 = local_60->w;
    local_68 = local_60->h;
    local_6c = local_60->c;
    local_70 = local_6c / *(int *)(in_RDI + 0xd4);
    if (local_70 != *(int *)(in_RDI + 0xd0) + 5) {
      local_4 = -1;
      local_74 = 1;
      goto LAB_006b7c8c;
    }
    in_stack_fffffffffffffbb8 = &local_90;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)0x6b6e0a);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)0x6b6e17);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    for (local_b8 = 0; local_b8 < *(int *)(in_RDI + 0xd4); local_b8 = local_b8 + 1) {
      local_bc = local_b8 * local_70;
      in_stack_fffffffffffffbb0 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xe0),(long)(local_b8 * 2))
      ;
      local_c0 = *in_stack_fffffffffffffbb0;
      pfVar4 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xe0),(long)(local_b8 * 2 + 1));
      local_c4 = *pfVar4;
      ncnn::Mat::channel((Mat *)in_stack_fffffffffffffb38._M_current,
                         (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
      pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_118);
      ncnn::Mat::~Mat((Mat *)0x6b6f55);
      local_d0 = pfVar4;
      ncnn::Mat::channel((Mat *)in_stack_fffffffffffffb38._M_current,
                         (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
      pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_168);
      ncnn::Mat::~Mat((Mat *)0x6b6fa9);
      local_120 = pfVar4;
      ncnn::Mat::channel((Mat *)in_stack_fffffffffffffb38._M_current,
                         (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
      pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_1b8);
      ncnn::Mat::~Mat((Mat *)0x6b6ffe);
      local_170 = pfVar4;
      ncnn::Mat::channel((Mat *)in_stack_fffffffffffffb38._M_current,
                         (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
      pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_208);
      ncnn::Mat::~Mat((Mat *)0x6b7053);
      local_1c0 = pfVar4;
      ncnn::Mat::channel((Mat *)in_stack_fffffffffffffb38._M_current,
                         (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
      pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_258);
      ncnn::Mat::~Mat((Mat *)0x6b70a5);
      local_210 = pfVar4;
      ncnn::Mat::channel_range
                ((Mat *)in_stack_fffffffffffffb38._M_current,
                 (int)((ulong)in_stack_fffffffffffffb30 >> 0x20),(int)in_stack_fffffffffffffb30);
      (**(code **)(**(long **)(in_RDI + 0x128) + 0x48))
                (*(long **)(in_RDI + 0x128),local_2a0,local_50._48_8_);
      for (local_2a4 = 0; local_2a4 < local_68; local_2a4 = local_2a4 + 1) {
        for (local_2a8 = 0; local_2a8 < local_64; local_2a8 = local_2a8 + 1) {
          fVar10 = (float)local_2a8;
          fVar11 = sigmoid(0.0);
          local_2ac = (fVar10 + fVar11) / (float)local_64;
          fVar10 = (float)local_2a4;
          fVar11 = sigmoid(0.0);
          local_2b0 = (fVar10 + fVar11) / (float)local_68;
          dVar12 = std::exp((double)(ulong)(uint)*local_170);
          in_stack_fffffffffffffb6c = SUB84(dVar12,0);
          local_2b4 = (in_stack_fffffffffffffb6c * local_c0) / (float)local_64;
          dVar12 = std::exp((double)(ulong)(uint)*local_1c0);
          in_stack_fffffffffffffb68 = SUB84(dVar12,0);
          local_2b8 = (in_stack_fffffffffffffb68 * local_c4) / (float)local_68;
          local_2bc = local_2ac - local_2b4 * 0.5;
          local_2c0 = local_2b0 - local_2b8 * 0.5;
          local_2c4 = local_2ac + local_2b4 * 0.5;
          local_2c8 = local_2b0 + local_2b8 * 0.5;
          in_stack_fffffffffffffb64 = sigmoid(0.0);
          local_2d0 = 0;
          local_2d4 = 0.0;
          local_2cc = in_stack_fffffffffffffb64;
          for (local_2d8 = 0; local_2d8 < *(int *)(in_RDI + 0xd0); local_2d8 = local_2d8 + 1) {
            ncnn::Mat::channel((Mat *)in_stack_fffffffffffffb38._M_current,
                               (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
            in_stack_fffffffffffffb58._M_current = (BBoxRect *)ncnn::Mat::row(&local_328,local_2a4);
            in_stack_fffffffffffffb54 = (&(in_stack_fffffffffffffb58._M_current)->xmin)[local_2a8];
            ncnn::Mat::~Mat((Mat *)0x6b73c0);
            if (local_2d4 < in_stack_fffffffffffffb54) {
              local_2d0 = local_2d8;
              local_2d4 = in_stack_fffffffffffffb54;
            }
            local_2dc = in_stack_fffffffffffffb54;
          }
          local_32c = local_2cc * local_2d4;
          if (*(float *)(in_RDI + 0xd8) <= local_32c) {
            local_340 = local_2bc;
            local_33c = local_2c0;
            local_338 = local_2c4;
            local_334 = local_2c8;
            local_330 = local_2d0;
            std::
            vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
            ::operator[](&local_90,(long)local_b8);
            std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                       in_stack_fffffffffffffb20,
                       (value_type *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
            std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::operator[](&local_a8,(long)local_b8);
            std::vector<float,_std::allocator<float>_>::push_back
                      (in_stack_fffffffffffffb20,
                       (value_type_conflict4 *)
                       CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
          }
          local_d0 = local_d0 + 1;
          local_120 = local_120 + 1;
          local_170 = local_170 + 1;
          local_1c0 = local_1c0 + 1;
          local_210 = local_210 + 1;
        }
      }
      ncnn::Mat::~Mat((Mat *)0x6b76b7);
    }
    for (local_344 = 0; local_344 < *(int *)(in_RDI + 0xd4); local_344 = local_344 + 1) {
      local_350 = std::
                  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                  ::operator[](&local_90,(long)local_344);
      local_358 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[](&local_a8,(long)local_344);
      local_368 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffffb08);
      __gnu_cxx::
      __normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>
      ::__normal_iterator<ncnn::BBoxRect*>
                ((__normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)in_stack_fffffffffffffb10,
                 (__normal_iterator<ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)in_stack_fffffffffffffb08);
      local_370 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::begin
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffffb08);
      local_378 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffffb08);
      __position._M_current._4_4_ = in_stack_fffffffffffffb6c;
      __position._M_current._0_4_ = in_stack_fffffffffffffb68;
      __first._M_current._4_4_ = in_stack_fffffffffffffb64;
      __first._M_current._0_4_ = in_stack_fffffffffffffb60;
      local_380 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                  insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                             __position,__first,in_stack_fffffffffffffb58);
      in_stack_fffffffffffffb30 = (Mat *)local_50;
      local_390 = (float *)std::vector<float,_std::allocator<float>_>::end
                                     (in_stack_fffffffffffffb08);
      __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
      __normal_iterator<float*>
                ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffffb10,
                 (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffffb08);
      local_398 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                     (in_stack_fffffffffffffb08);
      local_3a0 = (float *)std::vector<float,_std::allocator<float>_>::end
                                     (in_stack_fffffffffffffb08);
      __position_00._M_current._4_4_ = in_stack_fffffffffffffb6c;
      __position_00._M_current._0_4_ = in_stack_fffffffffffffb68;
      __first_00._M_current._4_4_ = in_stack_fffffffffffffb64;
      __first_00._M_current._0_4_ = in_stack_fffffffffffffb60;
      in_stack_fffffffffffffb38 =
           std::vector<float,std::allocator<float>>::
           insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                     ((vector<float,_std::allocator<float>_> *)
                      CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),__position_00,
                      __first_00,
                      (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                      )in_stack_fffffffffffffb58._M_current);
      local_3a8 = in_stack_fffffffffffffb38._M_current;
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)in_stack_fffffffffffffb20);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)in_stack_fffffffffffffb20);
    local_58 = (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
               ((long)&(local_58->
                       super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b = 0; b < bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector<std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp * 2];
            const float bias_h = biases[pp * 2 + 1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p + 1);
            const float* wptr = bottom_top_blob.channel(p + 2);
            const float* hptr = bottom_top_blob.channel(p + 3);

            const float* box_score_ptr = bottom_top_blob.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p + 5, num_class);
            softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / w);
                    float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / h);

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //                 NCNN_LOGE("%d %f %f", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = {bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}